

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse2::
     BVHNIntersector1<4,_1,_false,_embree::sse2::ArrayIntersector1<embree::sse2::InstanceIntersector1>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  undefined1 (*pauVar6) [16];
  undefined1 (*pauVar7) [16];
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Intersectors *pIVar13;
  InstancePrimitive *prim;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  Precalculations pre;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1029 [69];
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar7 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar63 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar67 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar49 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar20 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    fVar21 = (ray->super_RayK<1>).dir.field_0.m128[0];
    fVar22 = (ray->super_RayK<1>).dir.field_0.m128[1];
    fVar46 = (ray->super_RayK<1>).dir.field_0.m128[2];
    fVar47 = (ray->super_RayK<1>).dir.field_0.m128[3];
    fVar50 = 0.0;
    if (0.0 <= fVar20) {
      fVar50 = fVar20;
    }
    fVar20 = (ray->super_RayK<1>).tfar;
    fVar19 = 0.0;
    if (0.0 <= fVar20) {
      fVar19 = fVar20;
    }
    uVar15 = -(uint)(1e-18 <= ABS(fVar21));
    uVar16 = -(uint)(1e-18 <= ABS(fVar22));
    uVar17 = -(uint)(1e-18 <= ABS(fVar46));
    uVar18 = -(uint)(1e-18 <= ABS(fVar47));
    auVar27._0_4_ = (uint)fVar21 & uVar15;
    auVar27._4_4_ = (uint)fVar22 & uVar16;
    auVar27._8_4_ = (uint)fVar46 & uVar17;
    auVar27._12_4_ = (uint)fVar47 & uVar18;
    auVar33._0_8_ = CONCAT44(~uVar16,~uVar15) & 0x219392ef219392ef;
    auVar33._8_4_ = ~uVar17 & 0x219392ef;
    auVar33._12_4_ = ~uVar18 & 0x219392ef;
    auVar33 = auVar33 | auVar27;
    auVar27 = rcpps(auVar27,auVar33);
    fVar54 = auVar27._0_4_;
    fVar56 = auVar27._4_4_;
    fVar58 = auVar27._8_4_;
    fVar54 = (1.0 - auVar33._0_4_ * fVar54) * fVar54 + fVar54;
    fVar56 = (1.0 - auVar33._4_4_ * fVar56) * fVar56 + fVar56;
    fVar58 = (1.0 - auVar33._8_4_ * fVar58) * fVar58 + fVar58;
    uVar11 = (ulong)(fVar54 < 0.0) << 4;
    uVar12 = (ulong)(fVar56 < 0.0) << 4 | 0x20;
    uVar9 = (ulong)(fVar58 < 0.0) << 4 | 0x40;
    uVar14 = uVar11 ^ 0x10;
    uVar10 = uVar12 ^ 0x10;
    local_1029._49_8_ = context;
    local_1029._41_8_ = ray;
    local_f88 = fVar49;
    fStack_f84 = fVar49;
    fStack_f80 = fVar49;
    fStack_f7c = fVar49;
    local_f98 = fVar50;
    fStack_f94 = fVar50;
    fStack_f90 = fVar50;
    fStack_f8c = fVar50;
    local_fa8 = fVar58;
    fStack_fa4 = fVar58;
    fStack_fa0 = fVar58;
    fStack_f9c = fVar58;
    local_fb8 = fVar63;
    fStack_fb4 = fVar63;
    fStack_fb0 = fVar63;
    fStack_fac = fVar63;
    local_fc8 = fVar67;
    fStack_fc4 = fVar67;
    fStack_fc0 = fVar67;
    fStack_fbc = fVar67;
    local_fd8 = fVar54;
    fStack_fd4 = fVar54;
    fStack_fd0 = fVar54;
    fStack_fcc = fVar54;
    local_1029._65_4_ = fVar56;
    fStack_fe4 = fVar56;
    fStack_fe0 = fVar56;
    fStack_fdc = fVar56;
    local_1029._9_8_ = uVar11;
    local_1029._1_8_ = uVar12;
    fVar73 = fVar56;
    fVar72 = fVar56;
    fVar71 = fVar56;
    fVar70 = fVar54;
    fVar69 = fVar54;
    fVar68 = fVar54;
    fVar66 = fVar67;
    fVar65 = fVar67;
    fVar64 = fVar67;
    fVar62 = fVar63;
    fVar61 = fVar63;
    fVar60 = fVar63;
    fVar59 = fVar58;
    fVar57 = fVar58;
    fVar55 = fVar58;
    fVar53 = fVar50;
    fVar52 = fVar50;
    fVar51 = fVar50;
    fVar48 = fVar49;
    fVar47 = fVar49;
    fVar46 = fVar49;
    fVar22 = fVar19;
    fVar21 = fVar19;
    fVar20 = fVar19;
LAB_00d1d894:
    do {
      pauVar6 = pauVar7 + -1;
      pauVar7 = pauVar7 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar6 + 8) < *pfVar1 || *(float *)((long)*pauVar6 + 8) == *pfVar1) {
        pIVar13 = *(Intersectors **)*pauVar7;
        while (((ulong)pIVar13 & 8) == 0) {
          pfVar1 = (float *)((long)&(pIVar13->intersector1).intersect + uVar11);
          auVar45._0_4_ = (*pfVar1 - fVar60) * fVar68;
          auVar45._4_4_ = (pfVar1[1] - fVar61) * fVar69;
          auVar45._8_4_ = (pfVar1[2] - fVar62) * fVar70;
          auVar45._12_4_ = (pfVar1[3] - fVar63) * fVar54;
          pfVar1 = (float *)((long)&(pIVar13->intersector1).intersect + uVar12);
          auVar28._0_4_ = (*pfVar1 - fVar64) * fVar71;
          auVar28._4_4_ = (pfVar1[1] - fVar65) * fVar72;
          auVar28._8_4_ = (pfVar1[2] - fVar66) * fVar73;
          auVar28._12_4_ = (pfVar1[3] - fVar67) * fVar56;
          auVar27 = maxps(auVar45,auVar28);
          pfVar1 = (float *)((long)&(pIVar13->intersector1).intersect + uVar9);
          auVar29._0_4_ = (*pfVar1 - fVar46) * fVar55;
          auVar29._4_4_ = (pfVar1[1] - fVar47) * fVar57;
          auVar29._8_4_ = (pfVar1[2] - fVar48) * fVar59;
          auVar29._12_4_ = (pfVar1[3] - fVar49) * fVar58;
          auVar43._4_4_ = fVar52;
          auVar43._0_4_ = fVar51;
          auVar43._8_4_ = fVar53;
          auVar43._12_4_ = fVar50;
          auVar33 = maxps(auVar29,auVar43);
          local_1029._17_16_ = maxps(auVar27,auVar33);
          pfVar1 = (float *)((long)&(pIVar13->intersector1).intersect + uVar14);
          auVar30._0_4_ = (*pfVar1 - fVar60) * fVar68;
          auVar30._4_4_ = (pfVar1[1] - fVar61) * fVar69;
          auVar30._8_4_ = (pfVar1[2] - fVar62) * fVar70;
          auVar30._12_4_ = (pfVar1[3] - fVar63) * fVar54;
          pfVar1 = (float *)((long)&(pIVar13->intersector1).intersect + uVar10);
          auVar34._0_4_ = (*pfVar1 - fVar64) * fVar71;
          auVar34._4_4_ = (pfVar1[1] - fVar65) * fVar72;
          auVar34._8_4_ = (pfVar1[2] - fVar66) * fVar73;
          auVar34._12_4_ = (pfVar1[3] - fVar67) * fVar56;
          auVar27 = minps(auVar30,auVar34);
          pfVar1 = (float *)((long)&(pIVar13->intersector1).intersect + (uVar9 ^ 0x10));
          auVar35._0_4_ = (*pfVar1 - fVar46) * fVar55;
          auVar35._4_4_ = (pfVar1[1] - fVar47) * fVar57;
          auVar35._8_4_ = (pfVar1[2] - fVar48) * fVar59;
          auVar35._12_4_ = (pfVar1[3] - fVar49) * fVar58;
          auVar41._4_4_ = fVar21;
          auVar41._0_4_ = fVar20;
          auVar41._8_4_ = fVar22;
          auVar41._12_4_ = fVar19;
          auVar33 = minps(auVar35,auVar41);
          auVar27 = minps(auVar27,auVar33);
          auVar23._4_4_ = -(uint)(local_1029._21_4_ <= auVar27._4_4_);
          auVar23._0_4_ = -(uint)(local_1029._17_4_ <= auVar27._0_4_);
          auVar23._8_4_ = -(uint)(local_1029._25_4_ <= auVar27._8_4_);
          auVar23._12_4_ = -(uint)(local_1029._29_4_ <= auVar27._12_4_);
          uVar15 = movmskps((int)This,auVar23);
          This = (Intersectors *)(ulong)uVar15;
          if (uVar15 == 0) {
            if (pauVar7 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_00d1d894;
          }
          uVar8 = (ulong)pIVar13 & 0xfffffffffffffff0;
          This = (Intersectors *)0x0;
          if ((byte)uVar15 != 0) {
            for (; ((byte)uVar15 >> (long)This & 1) == 0;
                This = (Intersectors *)((long)&This->ptr + 1)) {
            }
          }
          pIVar13 = *(Intersectors **)(uVar8 + (long)This * 8);
          uVar15 = (uVar15 & 0xff) - 1 & uVar15 & 0xff;
          if (uVar15 != 0) {
            uVar16 = *(uint *)(local_1029 + (long)This * 4 + 0x11);
            lVar5 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            This = *(Intersectors **)(uVar8 + lVar5 * 8);
            uVar17 = *(uint *)(local_1029 + lVar5 * 4 + 0x11);
            uVar15 = uVar15 - 1 & uVar15;
            uVar11 = local_1029._9_8_;
            uVar12 = local_1029._1_8_;
            if (uVar15 == 0) {
              if (uVar16 < uVar17) {
                *(Intersectors **)*pauVar7 = This;
                *(uint *)((long)*pauVar7 + 8) = uVar17;
                pauVar7 = pauVar7 + 1;
              }
              else {
                *(Intersectors **)*pauVar7 = pIVar13;
                *(uint *)((long)*pauVar7 + 8) = uVar16;
                pauVar7 = pauVar7 + 1;
                pIVar13 = This;
              }
            }
            else {
              auVar24._8_4_ = uVar16;
              auVar24._0_8_ = pIVar13;
              auVar24._12_4_ = 0;
              auVar31._8_4_ = uVar17;
              auVar31._0_8_ = This;
              auVar31._12_4_ = 0;
              This = (Intersectors *)0x0;
              if (uVar15 != 0) {
                for (; (uVar15 >> (long)This & 1) == 0;
                    This = (Intersectors *)((long)&This->ptr + 1)) {
                }
              }
              uVar4 = *(ulong *)(uVar8 + (long)This * 8);
              iVar2 = *(int *)(local_1029 + (long)This * 4 + 0x11);
              auVar36._8_4_ = iVar2;
              auVar36._0_8_ = uVar4;
              auVar36._12_4_ = 0;
              auVar38._8_4_ = -(uint)((int)uVar16 < (int)uVar17);
              uVar15 = uVar15 - 1 & uVar15;
              if (uVar15 == 0) {
                auVar38._4_4_ = auVar38._8_4_;
                auVar38._0_4_ = auVar38._8_4_;
                auVar38._12_4_ = auVar38._8_4_;
                auVar27 = auVar24 & auVar38 | ~auVar38 & auVar31;
                auVar33 = auVar31 & auVar38 | ~auVar38 & auVar24;
                auVar39._8_4_ = -(uint)(auVar27._8_4_ < iVar2);
                auVar39._0_8_ = CONCAT44(auVar39._8_4_,auVar39._8_4_);
                auVar39._12_4_ = auVar39._8_4_;
                pIVar13 = (Intersectors *)(~auVar39._0_8_ & uVar4 | auVar27._0_8_ & auVar39._0_8_);
                auVar27 = auVar36 & auVar39 | ~auVar39 & auVar27;
                auVar25._8_4_ = -(uint)(auVar33._8_4_ < auVar27._8_4_);
                auVar25._4_4_ = auVar25._8_4_;
                auVar25._0_4_ = auVar25._8_4_;
                auVar25._12_4_ = auVar25._8_4_;
                *pauVar7 = ~auVar25 & auVar33 | auVar27 & auVar25;
                pauVar7[1] = auVar33 & auVar25 | ~auVar25 & auVar27;
                pauVar7 = pauVar7 + 2;
              }
              else {
                This = (Intersectors *)0x0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> (long)This & 1) == 0;
                      This = (Intersectors *)((long)&This->ptr + 1)) {
                  }
                }
                iVar3 = *(int *)(local_1029 + (long)This * 4 + 0x11);
                auVar42._8_4_ = iVar3;
                auVar42._0_8_ = *(undefined8 *)(uVar8 + (long)This * 8);
                auVar42._12_4_ = 0;
                auVar40._4_4_ = auVar38._8_4_;
                auVar40._0_4_ = auVar38._8_4_;
                auVar40._8_4_ = auVar38._8_4_;
                auVar40._12_4_ = auVar38._8_4_;
                auVar27 = auVar24 & auVar40 | ~auVar40 & auVar31;
                auVar33 = auVar31 & auVar40 | ~auVar40 & auVar24;
                auVar44._0_4_ = -(uint)(iVar2 < iVar3);
                auVar44._4_4_ = -(uint)(iVar2 < iVar3);
                auVar44._8_4_ = -(uint)(iVar2 < iVar3);
                auVar44._12_4_ = -(uint)(iVar2 < iVar3);
                auVar41 = auVar36 & auVar44 | ~auVar44 & auVar42;
                auVar45 = ~auVar44 & auVar36 | auVar42 & auVar44;
                auVar37._8_4_ = -(uint)(auVar33._8_4_ < auVar45._8_4_);
                auVar37._4_4_ = auVar37._8_4_;
                auVar37._0_4_ = auVar37._8_4_;
                auVar37._12_4_ = auVar37._8_4_;
                auVar43 = auVar33 & auVar37 | ~auVar37 & auVar45;
                auVar32._8_4_ = -(uint)(auVar27._8_4_ < auVar41._8_4_);
                auVar32._0_8_ = CONCAT44(auVar32._8_4_,auVar32._8_4_);
                auVar32._12_4_ = auVar32._8_4_;
                pIVar13 = (Intersectors *)
                          (auVar27._0_8_ & auVar32._0_8_ | ~auVar32._0_8_ & auVar41._0_8_);
                auVar27 = ~auVar32 & auVar27 | auVar41 & auVar32;
                auVar26._8_4_ = -(uint)(auVar27._8_4_ < auVar43._8_4_);
                auVar26._4_4_ = auVar26._8_4_;
                auVar26._0_4_ = auVar26._8_4_;
                auVar26._12_4_ = auVar26._8_4_;
                *pauVar7 = ~auVar37 & auVar33 | auVar45 & auVar37;
                pauVar7[1] = ~auVar26 & auVar27 | auVar43 & auVar26;
                pauVar7[2] = auVar27 & auVar26 | ~auVar26 & auVar43;
                pauVar7 = pauVar7 + 3;
              }
            }
          }
        }
        local_1029._57_8_ = (ulong)((uint)pIVar13 & 0xf) - 8;
        if (local_1029._57_8_ != 0) {
          prim = (InstancePrimitive *)((ulong)pIVar13 & 0xfffffffffffffff0);
          do {
            This = (Intersectors *)local_1029;
            InstanceIntersector1::intersect((Precalculations *)This,ray,context,prim);
            prim = prim + 1;
            local_1029._57_8_ = local_1029._57_8_ + -1;
            context = (RayQueryContext *)local_1029._49_8_;
            ray = (RayHit *)local_1029._41_8_;
          } while (local_1029._57_8_ != 0);
        }
        fVar20 = (ray->super_RayK<1>).tfar;
        uVar11 = local_1029._9_8_;
        uVar12 = local_1029._1_8_;
        fVar21 = fVar20;
        fVar22 = fVar20;
        fVar19 = fVar20;
        fVar46 = local_f88;
        fVar47 = fStack_f84;
        fVar48 = fStack_f80;
        fVar49 = fStack_f7c;
        fVar51 = local_f98;
        fVar52 = fStack_f94;
        fVar53 = fStack_f90;
        fVar50 = fStack_f8c;
        fVar55 = local_fa8;
        fVar57 = fStack_fa4;
        fVar59 = fStack_fa0;
        fVar58 = fStack_f9c;
        fVar60 = local_fb8;
        fVar61 = fStack_fb4;
        fVar62 = fStack_fb0;
        fVar63 = fStack_fac;
        fVar64 = local_fc8;
        fVar65 = fStack_fc4;
        fVar66 = fStack_fc0;
        fVar67 = fStack_fbc;
        fVar68 = local_fd8;
        fVar69 = fStack_fd4;
        fVar70 = fStack_fd0;
        fVar54 = fStack_fcc;
        fVar71 = (float)local_1029._65_4_;
        fVar72 = fStack_fe4;
        fVar73 = fStack_fe0;
        fVar56 = fStack_fdc;
      }
    } while (pauVar7 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }